

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryMLT.hpp
# Opt level: O1

void __thiscall
ddd::DictionaryMLT<false,_true>::DictionaryMLT
          (DictionaryMLT<false,_true> *this,
          vector<const_char_*,_std::allocator<const_char_*>_> *prefixes)

{
  DaTrie<false,_true,_true> *this_00;
  
  *(undefined ***)this = &PTR__DictionaryMLT_00136a80;
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  *(undefined8 *)(this + 0x20) = 0;
  *(undefined4 *)(this + 0x28) = 0xffffffff;
  *(undefined8 *)(this + 0x30) = 0;
  this_00 = (DaTrie<false,_true,_true> *)operator_new(0x70);
  DaTrie<false,_true,_true>::DaTrie(this_00,prefixes);
  std::
  __uniq_ptr_impl<ddd::DaTrie<false,_true,_true>,_std::default_delete<ddd::DaTrie<false,_true,_true>_>_>
  ::reset((__uniq_ptr_impl<ddd::DaTrie<false,_true,_true>,_std::default_delete<ddd::DaTrie<false,_true,_true>_>_>
           *)(this + 8),this_00);
  return;
}

Assistant:

DictionaryMLT(const std::vector<const char*>& prefixes) {
    prefix_subtrie_ = make_unique<PrefixTrieType>(prefixes);
  }